

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void SerializePrimitives(CJSON *json)

{
  ostream *poVar1;
  string local_148;
  undefined1 local_118 [8];
  PrimitiveTestClass ptc;
  CJSON *json_local;
  
  PrimitiveTestClass::PrimitiveTestClass((PrimitiveTestClass *)local_118);
  PrimitiveTestClass::AddValues((PrimitiveTestClass *)local_118);
  poVar1 = std::operator<<((ostream *)&std::cout,"PrimitiveTestClass: ");
  CJSON::Serialize<PrimitiveTestClass,_nullptr>(&local_148,json,(PrimitiveTestClass *)local_118);
  poVar1 = std::operator<<(poVar1,(string *)&local_148);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_148);
  PrimitiveTestClass::~PrimitiveTestClass((PrimitiveTestClass *)local_118);
  return;
}

Assistant:

void SerializePrimitives(CJSON &json)
{
    PrimitiveTestClass ptc;
    ptc.AddValues();

    cout << "PrimitiveTestClass: " << json.Serialize(ptc) << endl;
}